

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

RuleInfo * __thiscall
anon_unknown.dwarf_197ca2::BuildEngineImpl::getRuleInfoForKey(BuildEngineImpl *this,KeyType *key)

{
  KeyID keyID_00;
  __node_ptr p_Var1;
  RuleInfo *pRVar2;
  pointer *__ptr;
  __hash_code __code;
  KeyID keyID;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_38;
  key_type local_30;
  undefined4 extraout_var;
  
  keyID_00._value._0_4_ = (*(this->super_BuildDBDelegate)._vptr_BuildDBDelegate[2])();
  keyID_00._value._4_4_ = extraout_var;
  local_30._value = keyID_00._value;
  p_Var1 = std::
           _Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&(this->ruleInfos)._M_h,
                          keyID_00._value % (this->ruleInfos)._M_h._M_bucket_count,&local_30,
                          keyID_00._value);
  if (p_Var1 == (__node_ptr)0x0) {
    (*this->delegate->_vptr_BuildEngineDelegate[3])(&local_38,this->delegate,key);
    pRVar2 = addRule(this,keyID_00,&local_38);
    if (local_38._M_t.
        super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>._M_t.
        super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
        super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl + 8))
                ();
    }
  }
  else {
    pRVar2 = (RuleInfo *)
             ((long)&(p_Var1->
                     super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                     ._M_storage._M_storage + 8);
  }
  return pRVar2;
}

Assistant:

RuleInfo& getRuleInfoForKey(const KeyType& key) {
    auto keyID = getKeyID(key);

    // Check if we have already found the rule.
    auto it = ruleInfos.find(keyID);
    if (it != ruleInfos.end())
      return it->second;

    // Otherwise, request it from the delegate and add it.
    return addRule(keyID, delegate.lookupRule(key));
  }